

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_wrapper.hpp
# Opt level: O2

void __thiscall duckdb::MiniZStream::FormatException(MiniZStream *this,char *error_msg,int mz_ret)

{
  char *pcVar1;
  char *__rhs;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pcVar1 = duckdb_miniz::mz_error(mz_ret);
  ::std::__cxx11::string::string((string *)&local_40,": ",&local_81);
  ::std::operator+(&local_80,error_msg,&local_40);
  __rhs = "Unknown error code";
  if (pcVar1 != (char *)0x0) {
    __rhs = pcVar1;
  }
  ::std::operator+(&local_60,&local_80,__rhs);
  FormatException(this,&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void FormatException(const char *error_msg, int mz_ret) {
		auto err = duckdb_miniz::mz_error(mz_ret);
		FormatException(error_msg + std::string(": ") + (err ? err : "Unknown error code"));
	}